

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O1

int run_test_req_type_name(void)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_fs_type uVar3;
  int extraout_EAX;
  char *pcVar4;
  size_t sVar5;
  uv_loop_t *puVar6;
  int *piVar7;
  uv_loop_t *puVar8;
  uv_fs_t *req;
  ssize_t sVar9;
  uv_stat_t *puVar10;
  uv_stat_t *puVar11;
  uv_loop_t *unaff_RBX;
  uv_pipe_t *unaff_R14;
  uv_os_fd_t uStack_4f4;
  sockaddr_in sStack_4f0;
  undefined1 auStack_4e0 [120];
  undefined1 auStack_468 [216];
  undefined1 auStack_390 [312];
  undefined1 auStack_258 [248];
  undefined1 auStack_160 [272];
  uv_pipe_t *puStack_50;
  uv_timeval64_t uStack_40;
  
  pcVar4 = uv_req_type_name(UV_REQ);
  iVar1 = strcmp(pcVar4,"req");
  if (iVar1 == 0) {
    pcVar4 = uv_req_type_name(UV_UDP_SEND);
    iVar1 = strcmp(pcVar4,"udp_send");
    if (iVar1 != 0) goto LAB_00159e8f;
    pcVar4 = uv_req_type_name(UV_WORK);
    iVar1 = strcmp(pcVar4,"work");
    if (iVar1 != 0) goto LAB_00159e94;
    pcVar4 = uv_req_type_name(UV_REQ_TYPE_MAX);
    if (pcVar4 != (char *)0x0) goto LAB_00159e99;
    pcVar4 = uv_req_type_name(UV_GETADDRINFO|UV_SHUTDOWN);
    if (pcVar4 != (char *)0x0) goto LAB_00159e9e;
    pcVar4 = uv_req_type_name(UV_UNKNOWN_REQ);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_req_type_name_cold_1();
LAB_00159e8f:
    run_test_req_type_name_cold_2();
LAB_00159e94:
    run_test_req_type_name_cold_3();
LAB_00159e99:
    run_test_req_type_name_cold_4();
LAB_00159e9e:
    run_test_req_type_name_cold_5();
  }
  run_test_req_type_name_cold_6();
  uStack_40._8_8_ = 0x159eb5;
  sVar5 = uv_loop_size();
  uStack_40._8_8_ = 0x159ebd;
  puVar6 = (uv_loop_t *)malloc(sVar5);
  if (puVar6 == (uv_loop_t *)0x0) {
    uStack_40._8_8_ = 0x15a0bd;
    run_test_getters_setters_cold_19();
LAB_0015a0bd:
    uStack_40._8_8_ = 0x15a0c2;
    run_test_getters_setters_cold_1();
LAB_0015a0c2:
    uStack_40._8_8_ = 0x15a0c7;
    run_test_getters_setters_cold_2();
LAB_0015a0c7:
    uStack_40._8_8_ = 0x15a0cc;
    run_test_getters_setters_cold_3();
LAB_0015a0cc:
    uStack_40._8_8_ = 0x15a0d1;
    run_test_getters_setters_cold_4();
LAB_0015a0d1:
    uStack_40._8_8_ = 0x15a0d6;
    run_test_getters_setters_cold_5();
LAB_0015a0d6:
    uStack_40._8_8_ = 0x15a0db;
    run_test_getters_setters_cold_6();
LAB_0015a0db:
    uStack_40._8_8_ = 0x15a0e0;
    run_test_getters_setters_cold_7();
LAB_0015a0e0:
    uStack_40._8_8_ = 0x15a0e5;
    run_test_getters_setters_cold_8();
LAB_0015a0e5:
    uStack_40._8_8_ = 0x15a0ea;
    run_test_getters_setters_cold_9();
LAB_0015a0ea:
    uStack_40._8_8_ = 0x15a0ef;
    run_test_getters_setters_cold_10();
LAB_0015a0ef:
    uStack_40._8_8_ = 0x15a0f4;
    run_test_getters_setters_cold_11();
LAB_0015a0f4:
    uStack_40._8_8_ = 0x15a0f9;
    run_test_getters_setters_cold_12();
LAB_0015a0f9:
    uStack_40._8_8_ = 0x15a0fe;
    run_test_getters_setters_cold_13();
LAB_0015a0fe:
    uStack_40._8_8_ = 0x15a103;
    run_test_getters_setters_cold_14();
LAB_0015a103:
    uStack_40._8_8_ = 0x15a108;
    run_test_getters_setters_cold_15();
LAB_0015a108:
    uStack_40._8_8_ = 0x15a10d;
    run_test_getters_setters_cold_18();
LAB_0015a10d:
    uStack_40._8_8_ = 0x15a112;
    run_test_getters_setters_cold_16();
  }
  else {
    uStack_40._8_8_ = 0x159ed1;
    iVar1 = uv_loop_init(puVar6);
    unaff_RBX = puVar6;
    if (iVar1 != 0) goto LAB_0015a0bd;
    uStack_40._8_8_ = 0x159eeb;
    uv_loop_set_data(puVar6,&cookie1);
    if ((int *)puVar6->data != &cookie1) goto LAB_0015a0c2;
    uStack_40._8_8_ = 0x159efc;
    piVar7 = (int *)uv_loop_get_data(puVar6);
    if (piVar7 != &cookie1) goto LAB_0015a0c7;
    uStack_40._8_8_ = 0x159f0f;
    sVar5 = uv_handle_size(UV_NAMED_PIPE);
    uStack_40._8_8_ = 0x159f17;
    unaff_R14 = (uv_pipe_t *)malloc(sVar5);
    uStack_40._8_8_ = 0x159f27;
    uv_pipe_init(puVar6,unaff_R14,0);
    uStack_40._8_8_ = 0x159f2f;
    uVar2 = uv_handle_get_type((uv_handle_t *)unaff_R14);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_0015a0cc;
    uStack_40._8_8_ = 0x159f40;
    puVar8 = uv_handle_get_loop((uv_handle_t *)unaff_R14);
    if (puVar8 != puVar6) goto LAB_0015a0d1;
    unaff_R14->data = &cookie2;
    uStack_40._8_8_ = 0x159f5b;
    piVar7 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar7 != &cookie2) goto LAB_0015a0d6;
    uStack_40._8_8_ = 0x159f6f;
    uv_handle_set_data((uv_handle_t *)unaff_R14,&cookie1);
    uStack_40._8_8_ = 0x159f77;
    piVar7 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar7 != &cookie1) goto LAB_0015a0db;
    if ((int *)unaff_R14->data != &cookie1) goto LAB_0015a0e0;
    uStack_40._8_8_ = 0x159f91;
    sVar5 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar5 != 0) goto LAB_0015a0e5;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size + 1;
    uStack_40._8_8_ = 0x159fa6;
    sVar5 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar5 != 1) goto LAB_0015a0ea;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size - 1;
    uStack_40._8_8_ = 0x159fbe;
    uv_close((uv_handle_t *)unaff_R14,(uv_close_cb)0x0);
    uStack_40._8_8_ = 0x159fc8;
    iVar1 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015a0ef;
    uStack_40._8_8_ = 0x159fda;
    sVar5 = uv_req_size(UV_FS);
    uStack_40._8_8_ = 0x159fe2;
    req = (uv_fs_t *)malloc(sVar5);
    uStack_40._8_8_ = 0x159ff9;
    uv_fs_stat(puVar6,req,".",(uv_fs_cb)0x0);
    uStack_40._8_8_ = 0x15a003;
    iVar1 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015a0f4;
    uStack_40._8_8_ = 0x15a013;
    uVar3 = uv_fs_get_type(req);
    if (uVar3 != UV_FS_STAT) goto LAB_0015a0f9;
    uStack_40._8_8_ = 0x15a024;
    sVar9 = uv_fs_get_result(req);
    if (sVar9 != 0) goto LAB_0015a0fe;
    uStack_40._8_8_ = 0x15a035;
    puVar10 = (uv_stat_t *)uv_fs_get_ptr(req);
    uStack_40._8_8_ = 0x15a040;
    puVar11 = uv_fs_get_statbuf(req);
    if (puVar10 != puVar11) goto LAB_0015a103;
    uStack_40._8_8_ = 0x15a051;
    puVar10 = uv_fs_get_statbuf(req);
    if ((puVar10->st_mode & 0x4000) == 0) goto LAB_0015a108;
    uStack_40._8_8_ = 0x15a063;
    pcVar4 = uv_fs_get_path(req);
    uStack_40._8_8_ = 0x15a072;
    iVar1 = strcmp(pcVar4,".");
    if (iVar1 != 0) goto LAB_0015a10d;
    uStack_40._8_8_ = 0x15a082;
    uv_fs_req_cleanup(req);
    uStack_40._8_8_ = 0x15a08a;
    iVar1 = uv_loop_close(puVar6);
    if (iVar1 == 0) {
      uStack_40._8_8_ = 0x15a09a;
      free(unaff_R14);
      uStack_40._8_8_ = 0x15a0a2;
      free(req);
      uStack_40._8_8_ = 0x15a0aa;
      free(puVar6);
      return 0;
    }
  }
  uStack_40._8_8_ = 0x15a117;
  run_test_getters_setters_cold_17();
  uStack_40.tv_sec = 0;
  puStack_50 = (uv_pipe_t *)0x15a12d;
  iVar1 = uv_gettimeofday(&uStack_40);
  if (iVar1 == 0) {
    if ((void *)uStack_40.tv_sec == (void *)0x0) goto LAB_0015a151;
    puStack_50 = (uv_pipe_t *)0x15a140;
    iVar1 = uv_gettimeofday((uv_timeval64_t *)0x0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    puStack_50 = (uv_pipe_t *)0x15a151;
    run_test_gettimeofday_cold_1();
LAB_0015a151:
    puStack_50 = (uv_pipe_t *)0x15a156;
    run_test_gettimeofday_cold_3();
  }
  puStack_50 = (uv_pipe_t *)0x15a15b;
  run_test_gettimeofday_cold_2();
  auStack_160._264_8_ = unaff_RBX;
  puStack_50 = unaff_R14;
  puVar8 = uv_default_loop();
  puVar6 = (uv_loop_t *)0x1a4b5a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4f0);
  if (iVar1 == 0) {
    puVar6 = puVar8;
    iVar1 = uv_idle_init(puVar8,(uv_idle_t *)auStack_4e0);
    if (iVar1 != 0) goto LAB_0015a49d;
    puVar6 = (uv_loop_t *)auStack_4e0;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -0x16) goto LAB_0015a4a2;
    uv_close((uv_handle_t *)auStack_4e0,(uv_close_cb)0x0);
    puVar6 = puVar8;
    iVar1 = uv_tcp_init(puVar8,(uv_tcp_t *)auStack_258);
    if (iVar1 != 0) goto LAB_0015a4a7;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4ac;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar6,(sockaddr *)&sStack_4f0,0);
    if (iVar1 != 0) goto LAB_0015a4b1;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a4b6;
    puVar6 = (uv_loop_t *)auStack_258;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4bb;
    puVar6 = puVar8;
    iVar1 = uv_udp_init(puVar8,(uv_udp_t *)auStack_468);
    if (iVar1 != 0) goto LAB_0015a4c0;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4c5;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_udp_bind((uv_udp_t *)puVar6,(sockaddr *)&sStack_4f0,0);
    if (iVar1 != 0) goto LAB_0015a4ca;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a4cf;
    puVar6 = (uv_loop_t *)auStack_468;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4d4;
    puVar6 = puVar8;
    iVar1 = uv_pipe_init(puVar8,(uv_pipe_t *)auStack_160,0);
    if (iVar1 != 0) goto LAB_0015a4d9;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4de;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar6,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015a4e3;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a4e8;
    puVar6 = (uv_loop_t *)auStack_160;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a4ed;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015a446:
      uv_run(puVar8,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar1 = uv_loop_close(puVar6);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a4f2;
    }
    puVar6 = puVar8;
    iVar1 = uv_tty_init(puVar8,(uv_tty_t *)auStack_390,iVar1,0);
    if (iVar1 != 0) goto LAB_0015a4f7;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_readable((uv_stream_t *)puVar6);
    if (iVar1 == 0) goto LAB_0015a4fc;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_writable((uv_stream_t *)puVar6);
    if (iVar1 != 0) goto LAB_0015a501;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a506;
    puVar6 = (uv_loop_t *)auStack_390;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a50b;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_readable((uv_stream_t *)puVar6);
    if (iVar1 == 0) {
      puVar6 = (uv_loop_t *)auStack_390;
      iVar1 = uv_is_writable((uv_stream_t *)puVar6);
      if (iVar1 != 0) goto LAB_0015a515;
      goto LAB_0015a446;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015a49d:
    run_test_handle_fileno_cold_2();
LAB_0015a4a2:
    run_test_handle_fileno_cold_3();
LAB_0015a4a7:
    run_test_handle_fileno_cold_4();
LAB_0015a4ac:
    run_test_handle_fileno_cold_5();
LAB_0015a4b1:
    run_test_handle_fileno_cold_6();
LAB_0015a4b6:
    run_test_handle_fileno_cold_7();
LAB_0015a4bb:
    run_test_handle_fileno_cold_8();
LAB_0015a4c0:
    run_test_handle_fileno_cold_9();
LAB_0015a4c5:
    run_test_handle_fileno_cold_10();
LAB_0015a4ca:
    run_test_handle_fileno_cold_11();
LAB_0015a4cf:
    run_test_handle_fileno_cold_12();
LAB_0015a4d4:
    run_test_handle_fileno_cold_13();
LAB_0015a4d9:
    run_test_handle_fileno_cold_14();
LAB_0015a4de:
    run_test_handle_fileno_cold_15();
LAB_0015a4e3:
    run_test_handle_fileno_cold_16();
LAB_0015a4e8:
    run_test_handle_fileno_cold_17();
LAB_0015a4ed:
    run_test_handle_fileno_cold_18();
LAB_0015a4f2:
    run_test_handle_fileno_cold_27();
LAB_0015a4f7:
    run_test_handle_fileno_cold_19();
LAB_0015a4fc:
    run_test_handle_fileno_cold_25();
LAB_0015a501:
    run_test_handle_fileno_cold_20();
LAB_0015a506:
    run_test_handle_fileno_cold_21();
LAB_0015a50b:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015a515:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)puVar6);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(req_type_name) {
  ASSERT(strcmp(uv_req_type_name(UV_REQ), "req") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_UDP_SEND), "udp_send") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_WORK), "work") == 0);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX) == NULL);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL);
  ASSERT(uv_req_type_name(UV_UNKNOWN_REQ) == NULL);
  return 0;
}